

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::ParseInsertion(DXFImporter *this,LineReader *reader,FileData *output)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  string *psVar5;
  float fVar6;
  byte local_89;
  InsertBlock *bl;
  InsertBlock local_60;
  FileData *local_20;
  FileData *output_local;
  LineReader *reader_local;
  DXFImporter *this_local;
  
  local_20 = output;
  output_local = (FileData *)reader;
  reader_local = (LineReader *)this;
  pvVar3 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::back
                     (&output->blocks);
  DXF::InsertBlock::InsertBlock(&local_60);
  std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>::push_back
            (&pvVar3->insertions,&local_60);
  DXF::InsertBlock::~InsertBlock(&local_60);
  pvVar3 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::back
                     (&local_20->blocks);
  pvVar4 = std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>::back
                     (&pvVar3->insertions);
  while( true ) {
    bVar1 = DXF::LineReader::End((LineReader *)output_local);
    local_89 = 0;
    if (!bVar1) {
      bVar1 = DXF::LineReader::Is((LineReader *)output_local,0);
      local_89 = bVar1 ^ 0xff;
    }
    if ((local_89 & 1) == 0) break;
    iVar2 = DXF::LineReader::GroupCode((LineReader *)output_local);
    switch(iVar2) {
    case 2:
      psVar5 = DXF::LineReader::Value_abi_cxx11_((LineReader *)output_local);
      std::__cxx11::string::operator=((string *)&pvVar4->name,(string *)psVar5);
      break;
    case 10:
      fVar6 = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      (pvVar4->pos).x = fVar6;
      break;
    case 0x14:
      fVar6 = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      (pvVar4->pos).y = fVar6;
      break;
    case 0x1e:
      fVar6 = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      (pvVar4->pos).z = fVar6;
      break;
    case 0x29:
      fVar6 = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      (pvVar4->scale).x = fVar6;
      break;
    case 0x2a:
      fVar6 = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      (pvVar4->scale).y = fVar6;
      break;
    case 0x2b:
      fVar6 = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      (pvVar4->scale).z = fVar6;
      break;
    case 0x32:
      fVar6 = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      pvVar4->angle = fVar6;
    }
    DXF::LineReader::operator++((LineReader *)output_local,0);
  }
  return;
}

Assistant:

void DXFImporter::ParseInsertion(DXF::LineReader& reader, DXF::FileData& output) {
    output.blocks.back().insertions.push_back( DXF::InsertBlock() );
    DXF::InsertBlock& bl = output.blocks.back().insertions.back();

    while( !reader.End() && !reader.Is(0)) {
        switch(reader.GroupCode()) {
            // name of referenced block
        case GroupCode_Name:
            bl.name = reader.Value();
            break;

            // translation
        case GroupCode_XComp:
            bl.pos.x = reader.ValueAsFloat();
            break;
        case GroupCode_YComp:
            bl.pos.y = reader.ValueAsFloat();
            break;
        case GroupCode_ZComp:
            bl.pos.z = reader.ValueAsFloat();
            break;

            // scaling
        case 41:
            bl.scale.x = reader.ValueAsFloat();
            break;
        case 42:
            bl.scale.y = reader.ValueAsFloat();
            break;
        case 43:
            bl.scale.z = reader.ValueAsFloat();
            break;

            // rotation angle
        case 50:
            bl.angle = reader.ValueAsFloat();
            break;
        }
        reader++;
    }
}